

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O1

int CBS_get_utf8(CBS *cbs,uint32_t *out)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint8_t c;
  undefined4 uStack_38;
  uint local_34;
  
  uStack_38 = (int)((ulong)in_RAX >> 0x18);
  iVar1 = CBS_get_u8(cbs,(uint8_t *)((long)&uStack_38 + 3));
  iVar5 = 0;
  if (iVar1 != 0) {
    uVar2 = (uint)uStack_38._3_1_;
    if (uStack_38 < 0) {
      uVar2 = (uint)uStack_38._3_1_;
      if ((uVar2 & 0xffffffe0) == 0xc0) {
        lVar6 = 1;
        _uStack_38 = CONCAT44(0x80,uStack_38);
        uVar3 = 0x1f;
      }
      else if ((uVar2 & 0xfffffff0) == 0xe0) {
        lVar6 = 2;
        _uStack_38 = CONCAT44(0x800,uStack_38);
        uVar3 = 0xf;
      }
      else {
        if ((uVar2 & 0xfffffff8) != 0xf0) {
          return 0;
        }
        lVar6 = 3;
        _uStack_38 = CONCAT44(0x10000,uStack_38);
        uVar3 = 7;
      }
      uVar2 = uVar2 & uVar3;
      do {
        uVar3 = uVar2;
        iVar1 = CBS_get_u8(cbs,(uint8_t *)((long)&uStack_38 + 3));
        if (iVar1 == 0) {
          return 0;
        }
        if ((uStack_38._3_1_ & 0xffffffc0) != 0x80) {
          return 0;
        }
        uVar4 = uVar3 << 6;
        uVar2 = uStack_38._3_1_ & 0x3f | uVar4;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      if ((uVar3 & 0x7fe0) == 0x360) {
        return 0;
      }
      if (uVar2 - 0xfdd0 < 0x20) {
        return 0;
      }
      if (0x10ffff < uVar4) {
        return 0;
      }
      if ((uVar2 & 0xfffe) == 0xfffe) {
        return 0;
      }
      if (uVar2 < local_34) {
        return 0;
      }
    }
    *out = uVar2;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int CBS_get_utf8(CBS *cbs, uint32_t *out) {
  uint8_t c;
  if (!CBS_get_u8(cbs, &c)) {
    return 0;
  }
  if (c <= 0x7f) {
    *out = c;
    return 1;
  }
  uint32_t v, lower_bound;
  size_t len;
  if ((c & TOP_BITS(3)) == TOP_BITS(2)) {
    v = c & BOTTOM_BITS(5);
    len = 1;
    lower_bound = 0x80;
  } else if ((c & TOP_BITS(4)) == TOP_BITS(3)) {
    v = c & BOTTOM_BITS(4);
    len = 2;
    lower_bound = 0x800;
  } else if ((c & TOP_BITS(5)) == TOP_BITS(4)) {
    v = c & BOTTOM_BITS(3);
    len = 3;
    lower_bound = 0x10000;
  } else {
    return 0;
  }
  for (size_t i = 0; i < len; i++) {
    if (!CBS_get_u8(cbs, &c) ||
        (c & TOP_BITS(2)) != TOP_BITS(1)) {
      return 0;
    }
    v <<= 6;
    v |= c & BOTTOM_BITS(6);
  }
  if (!is_valid_code_point(v) ||
      v < lower_bound) {
    return 0;
  }
  *out = v;
  return 1;
}